

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::
best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
::try_update(best_solution_recorder<baryonyx::itm::quadratic_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
             *this,local_context *ctx,bit_array *solution,double value,long loop)

{
  bool bVar1;
  size_t hash;
  long lVar2;
  bit_array_hash local_39;
  double local_38;
  
  local_38 = value;
  hash = bit_array_hash::operator()(&local_39,solution);
  bVar1 = storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>::
          can_be_inserted(&this->m_storage,hash,local_38);
  if (bVar1) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>::insert
              (&this->m_storage,ctx,solution,hash,local_38,
               (double)(lVar2 - (this->m_start).__d.__r) / 1000000000.0,loop);
  }
  return;
}

Assistant:

void try_update(local_context& ctx,
                    const bit_array& solution,
                    const double value,
                    const long int loop)
    {
        auto hash = bit_array_hash()(solution);

        if (m_storage.can_be_inserted(hash, value)) {
            const auto end = std::chrono::steady_clock::now();
            const auto duration = compute_duration(m_start, end);

            m_storage.insert(ctx, solution, hash, value, duration, loop);
        }
    }